

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_int64(sqlite3_stmt *pStmt,int i,sqlite_int64 iValue)

{
  Mem *pMem;
  int iVar1;
  long lVar2;
  
  iVar1 = vdbeUnbind((Vdbe *)pStmt,i - 1U);
  if (iVar1 == 0) {
    lVar2 = (long)(int)(i - 1U) * 0x38;
    pMem = (Mem *)(*(long *)(pStmt + 0x80) + lVar2);
    if ((*(byte *)(*(long *)(pStmt + 0x80) + 0x15 + lVar2) & 0x90) == 0) {
      (pMem->u).i = iValue;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,iValue);
    }
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_int64(sqlite3_stmt *pStmt, int i, sqlite_int64 iValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
    assert( p!=0 && p->aVar!=0 && i>0 && i<=p->nVar ); /* tag-20240917-01 */
    sqlite3VdbeMemSetInt64(&p->aVar[i-1], iValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}